

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O3

int Gia_ManSimParamRead(char *pFileName,int *pnIns,int *pnWords)

{
  bool bVar1;
  uint uVar2;
  FILE *__stream;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    return 0;
  }
  uVar7 = 0;
  uVar8 = 0;
  uVar5 = 0xffffffff;
  do {
    bVar1 = true;
    do {
      do {
        bVar3 = bVar1;
        uVar2 = fgetc(__stream);
        bVar1 = false;
      } while (uVar2 == 0x2e);
      if (uVar2 == 0xffffffff) {
        if ((int)(uVar7 & 0x8000003f) < 1) {
          *pnIns = uVar5 - 1;
          uVar5 = uVar7 + 0x3f;
          if (-1 < (int)uVar7) {
            uVar5 = uVar7;
          }
          *pnWords = (int)uVar5 >> 6;
          fclose(__stream);
          return 1;
        }
        printf("The number of lines (%d) is not divisible by 64.\n",(ulong)uVar7);
LAB_0074a5af:
        fclose(__stream);
        return 0;
      }
      uVar4 = 0;
      uVar6 = uVar5;
      if (uVar2 == 10) {
        if (bVar3) {
          uVar6 = uVar8;
          if ((uVar5 != 0xffffffff) && (uVar6 = uVar5, uVar5 != uVar8)) {
            printf("The number of symbols (%d) does not match other lines (%d).\n",(ulong)uVar8,
                   (ulong)uVar5);
            goto LAB_0074a5af;
          }
          uVar7 = uVar7 + 1;
          uVar4 = 0;
          uVar8 = 0;
        }
        goto LAB_0074a58d;
      }
      bVar1 = false;
    } while (!bVar3);
    uVar4 = (uint)((uVar2 & 0xfffffffe) == 0x30);
LAB_0074a58d:
    uVar8 = uVar8 + uVar4;
    uVar5 = uVar6;
  } while( true );
}

Assistant:

int Gia_ManSimParamRead( char * pFileName, int * pnIns, int * pnWords )
{
    int c, nIns = -1, nLines = 0, Count = 0, fReadDot = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return 0;
    }
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '.' )
            fReadDot = 1;
        if ( c == '\n' )
        {
            if ( !fReadDot )
            {
                if ( nIns == -1 )
                    nIns = Count;
                else if ( nIns != Count )
                {
                    printf( "The number of symbols (%d) does not match other lines (%d).\n", Count, nIns );
                    fclose( pFile );
                    return 0;
                }
                Count = 0;
                nLines++;
            }
            fReadDot = 0;
        }
        if ( fReadDot )
            continue;
        if ( c != '0' && c != '1' )
            continue;
        Count++;
    }
    if ( nLines % 64 > 0 )
    {
        printf( "The number of lines (%d) is not divisible by 64.\n", nLines );
        fclose( pFile );
        return 0;
    }
    *pnIns = nIns - 1;
    *pnWords = nLines / 64;
    //printf( "Expecting %d inputs and %d words of simulation data.\n", *pnIns, *pnWords );
    fclose( pFile );
    return 1;
}